

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O1

void test_common<signed_char>(uint length,char value)

{
  ulong __n;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __s;
  uint i;
  int iVar1;
  void *__s_00;
  long lVar2;
  ulong uVar3;
  undefined8 *puVar4;
  shared_ptr<signed_char> pa;
  shared_ptr<signed_char> pb;
  
  __n = (ulong)length;
  __s_00 = operator_new__((long)(int)(length + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<signed_char*,void(*)(signed_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,__s_00,
             nosimd::common::free<signed_char>);
  pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__((long)(int)(length + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<signed_char*,void(*)(signed_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,
             pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<signed_char>);
  __s._M_pi = pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(undefined1 *)((long)__s_00 + __n) = 0x7f;
  *(undefined1 *)
   ((long)&(pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + __n) = 0x3f;
  if (0 < (int)length) {
    memset(__s_00,(uint)(byte)value,__n);
  }
  if (length != 0) {
    lVar2 = 0;
    do {
      if (*(char *)((long)__s_00 + lVar2) != value) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_common(unsigned int, T) [T = signed char]";
        *(undefined4 *)(puVar4 + 1) = 0x16;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      lVar2 = lVar2 + 1;
    } while (length != (uint)lVar2);
  }
  if (0 < (int)length) {
    uVar3 = 0;
    do {
      *(undefined1 *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar3) =
           *(undefined1 *)((long)__s_00 + uVar3);
      uVar3 = uVar3 + 1;
    } while (__n != uVar3);
  }
  if (length != 0) {
    lVar2 = 0;
    do {
      if (*(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + lVar2) != value) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_common(unsigned int, T) [T = signed char]";
        *(undefined4 *)(puVar4 + 1) = 0x1d;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      lVar2 = lVar2 + 1;
    } while (length != (uint)lVar2);
  }
  if (0 < (int)length) {
    memset(__s._M_pi,0,__n);
  }
  if (length != 0) {
    lVar2 = 0;
    do {
      if (*(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + lVar2) != '\0') {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_common(unsigned int, T) [T = signed char]";
        *(undefined4 *)(puVar4 + 1) = 0x24;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      lVar2 = lVar2 + 1;
    } while (length != (uint)lVar2);
    uVar3 = 0;
    do {
      *(char *)((long)__s_00 + uVar3) = (char)uVar3;
      uVar3 = uVar3 + 1;
    } while (__n != uVar3);
  }
  if (0 < (int)length) {
    uVar3 = 0;
    do {
      *(undefined1 *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar3) =
           *(undefined1 *)((long)__s_00 + uVar3);
      uVar3 = uVar3 + 1;
    } while (__n != uVar3);
  }
  if (length != 0) {
    iVar1 = 0;
    lVar2 = 0;
    do {
      if (iVar1 >> 0x18 != (int)*(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + lVar2)) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_common(unsigned int, T) [T = signed char]";
        *(undefined4 *)(puVar4 + 1) = 0x2d;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      lVar2 = lVar2 + 1;
      iVar1 = iVar1 + 0x1000000;
    } while (length != (uint)lVar2);
  }
  if ((*(char *)((long)__s_00 + __n) == '\x7f') &&
     (*(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + __n) == '?')) {
    if (pb.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
       ) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
       ) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar4 = "void test_common(unsigned int, T) [T = signed char]";
  *(undefined4 *)(puVar4 + 1) = 0x31;
  *(uint *)((long)puVar4 + 0xc) = length;
  __cxa_throw(puVar4,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}